

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_open_fp(mtar_t *tar,void *fp)

{
  tar->memory_size = 0;
  tar->memory_capacity = 0;
  tar->memory = (void *)0x0;
  tar->memory_pos = 0;
  tar->remaining_data = 0;
  tar->last_header = 0;
  tar->stream = (void *)0x0;
  tar->pos = 0;
  tar->seek = (mtar_seek_t)0x0;
  tar->close = (mtar_close_t)0x0;
  tar->read = (mtar_read_t)0x0;
  tar->write = (mtar_write_t)0x0;
  if (fp != (void *)0x0) {
    tar->write = mtar_file_write;
    tar->read = mtar_file_read;
    tar->seek = mtar_file_seek;
    tar->close = mtar_file_close;
    tar->stream = fp;
    return 0;
  }
  return -2;
}

Assistant:

int mtar_open_fp(mtar_t *tar, void *fp) {
  /* Init tar struct and functions */
  memset(tar, 0, sizeof(*tar));
  if (!fp) return MTAR_EOPENFAIL;

  tar->write = mtar_file_write;
  tar->read = mtar_file_read;
  tar->seek = mtar_file_seek;
  tar->close = mtar_file_close;
  tar->stream = fp;

  /* Return ok */
  return MTAR_ESUCCESS;
}